

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O3

Box __thiscall lunasvg::Element::getGlobalBoundingBox(Element *this)

{
  SVGNode *pSVar1;
  SVGElement *element;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  Box BVar2;
  Box local_40;
  Matrix local_30;
  
  pSVar1 = (this->super_Node).m_node;
  if (pSVar1 == (SVGNode *)0x0) {
    local_40.x = 0.0;
    local_40.y = 0.0;
    in_XMM1_Qa = 0;
  }
  else {
    SVGRootElement::updateLayout
              ((SVGRootElement *)
               (pSVar1->m_document->m_rootElement)._M_t.
               super___uniq_ptr_impl<lunasvg::SVGRootElement,_std::default_delete<lunasvg::SVGRootElement>_>
               ._M_t.
               super__Tuple_impl<0UL,_lunasvg::SVGRootElement_*,_std::default_delete<lunasvg::SVGRootElement>_>
               .super__Head_base<0UL,_lunasvg::SVGRootElement_*,_false>);
    (*pSVar1->_vptr_SVGNode[0xd])(pSVar1);
    local_40.x = extraout_XMM0_Da;
    local_40.y = extraout_XMM0_Db;
  }
  local_40.w = (float)in_XMM1_Qa;
  local_40.h = (float)((ulong)in_XMM1_Qa >> 0x20);
  getGlobalMatrix(&local_30,this);
  BVar2 = Box::transformed(&local_40,&local_30);
  return BVar2;
}

Assistant:

Box Element::getGlobalBoundingBox() const
{
    return getBoundingBox().transformed(getGlobalMatrix());
}